

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebug::~QDebug(QDebug *this)

{
  int *piVar1;
  Stream *pSVar2;
  Data *pDVar3;
  bool bVar4;
  int frameCount;
  long in_FS_OFFSET;
  QInternalMessageLogContext ctxt;
  QInternalMessageLogContext local_160;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = this->stream;
  if (pSVar2 != (Stream *)0x0) {
    piVar1 = &pSVar2->ref;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      if (pSVar2->space == true) {
        bVar4 = QString::endsWith(&pSVar2->buffer,(QChar)0x20,CaseSensitive);
        if (bVar4) {
          QString::chop(&this->stream->buffer,1);
        }
      }
      pSVar2 = this->stream;
      if (pSVar2->message_output == true) {
        memset(&local_160,0xaa,0x140);
        local_160.super_QMessageLogContext.version = 2;
        local_160.super_QMessageLogContext._4_8_ = 0;
        local_160.super_QMessageLogContext.file._4_4_ = 0;
        local_160.super_QMessageLogContext.function._0_4_ = 0;
        local_160.super_QMessageLogContext.function._4_4_ = 0;
        local_160.super_QMessageLogContext.category = (char *)0x0;
        local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
        _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
        super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
        frameCount = QInternalMessageLogContext::initFrom(&local_160,&pSVar2->context);
        if (frameCount != 0) {
          QInternalMessageLogContext::populateBacktrace(&local_160,frameCount);
        }
        qt_message_output(this->stream->type,&local_160.super_QMessageLogContext,
                          &this->stream->buffer);
        if (local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
            _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
            super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged == true) {
          local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
          _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
          super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
          if ((undefined1 *)
              local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
              _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
              super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
              super_QVLABase<void_*>.super_QVLABaseBase.ptr !=
              (undefined1 *)
              ((long)&local_160.backtrace.
                      super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                      super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                      super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_> + 0x18U)) {
            QtPrivate::sizedFree
                      (local_160.backtrace.
                       super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                       super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                       super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload.
                       _M_value.super_QVLABase<void_*>.super_QVLABaseBase.ptr,
                       local_160.backtrace.
                       super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                       super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                       super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload.
                       _M_value.super_QVLABase<void_*>.super_QVLABaseBase.a << 3);
          }
        }
      }
      pSVar2 = this->stream;
      if (pSVar2 != (Stream *)0x0) {
        pDVar3 = (pSVar2->buffer).d.d;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pSVar2->buffer).d.d)->super_QArrayData,2,0x10);
          }
        }
        ::QTextStream::~QTextStream(&pSVar2->ts);
        operator_delete(pSVar2,0x58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDebug::~QDebug()
{
    if (stream && !--stream->ref) {
        if (stream->space && stream->buffer.endsWith(u' '))
            stream->buffer.chop(1);
        if (stream->message_output) {
            QInternalMessageLogContext ctxt(stream->context);
            qt_message_output(stream->type,
                              ctxt,
                              stream->buffer);
        }
        delete stream;
    }
}